

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mgf_mask(uchar *dst,size_t dlen,uchar *src,size_t slen,mbedtls_md_context_t *md_ctx)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uchar counter [4];
  uchar mask [64];
  
  mask[0] = '\0';
  mask[1] = '\0';
  mask[2] = '\0';
  mask[3] = '\0';
  mask[4] = '\0';
  mask[5] = '\0';
  mask[6] = '\0';
  mask[7] = '\0';
  mask[8] = '\0';
  mask[9] = '\0';
  mask[10] = '\0';
  mask[0xb] = '\0';
  mask[0xc] = '\0';
  mask[0xd] = '\0';
  mask[0xe] = '\0';
  mask[0xf] = '\0';
  mask[0x10] = '\0';
  mask[0x11] = '\0';
  mask[0x12] = '\0';
  mask[0x13] = '\0';
  mask[0x14] = '\0';
  mask[0x15] = '\0';
  mask[0x16] = '\0';
  mask[0x17] = '\0';
  mask[0x18] = '\0';
  mask[0x19] = '\0';
  mask[0x1a] = '\0';
  mask[0x1b] = '\0';
  mask[0x1c] = '\0';
  mask[0x1d] = '\0';
  mask[0x1e] = '\0';
  mask[0x1f] = '\0';
  mask[0x20] = '\0';
  mask[0x21] = '\0';
  mask[0x22] = '\0';
  mask[0x23] = '\0';
  mask[0x24] = '\0';
  mask[0x25] = '\0';
  mask[0x26] = '\0';
  mask[0x27] = '\0';
  mask[0x28] = '\0';
  mask[0x29] = '\0';
  mask[0x2a] = '\0';
  mask[0x2b] = '\0';
  mask[0x2c] = '\0';
  mask[0x2d] = '\0';
  mask[0x2e] = '\0';
  mask[0x2f] = '\0';
  mask[0x30] = '\0';
  mask[0x31] = '\0';
  mask[0x32] = '\0';
  mask[0x33] = '\0';
  mask[0x34] = '\0';
  mask[0x35] = '\0';
  mask[0x36] = '\0';
  mask[0x37] = '\0';
  mask[0x38] = '\0';
  mask[0x39] = '\0';
  mask[0x3a] = '\0';
  mask[0x3b] = '\0';
  mask[0x3c] = '\0';
  mask[0x3d] = '\0';
  mask[0x3e] = '\0';
  mask[0x3f] = '\0';
  counter[0] = '\0';
  counter[1] = '\0';
  counter[2] = '\0';
  counter[3] = '\0';
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  for (; dlen != 0; dlen = dlen - uVar4) {
    uVar4 = (ulong)bVar1;
    if (dlen < bVar1) {
      uVar4 = dlen;
    }
    iVar2 = mbedtls_md_starts(md_ctx);
    if ((((iVar2 != 0) || (iVar2 = mbedtls_md_update(md_ctx,src,slen), iVar2 != 0)) ||
        (iVar2 = mbedtls_md_update(md_ctx,counter,4), iVar2 != 0)) ||
       (iVar2 = mbedtls_md_finish(md_ctx,mask), iVar2 != 0)) goto LAB_00116545;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dst[uVar3] = dst[uVar3] ^ mask[uVar3];
    }
    counter[3] = counter[3] + '\x01';
    dst = dst + uVar3;
  }
  iVar2 = 0;
LAB_00116545:
  mbedtls_zeroize(mask,0x40);
  return iVar2;
}

Assistant:

static int mgf_mask( unsigned char *dst, size_t dlen, unsigned char *src,
                      size_t slen, mbedtls_md_context_t *md_ctx )
{
    unsigned char mask[MBEDTLS_MD_MAX_SIZE];
    unsigned char counter[4];
    unsigned char *p;
    unsigned int hlen;
    size_t i, use_len;
    int ret = 0;

    memset( mask, 0, MBEDTLS_MD_MAX_SIZE );
    memset( counter, 0, 4 );

    hlen = mbedtls_md_get_size( md_ctx->md_info );

    /* Generate and apply dbMask */
    p = dst;

    while( dlen > 0 )
    {
        use_len = hlen;
        if( dlen < hlen )
            use_len = dlen;

        if( ( ret = mbedtls_md_starts( md_ctx ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_update( md_ctx, src, slen ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_update( md_ctx, counter, 4 ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_finish( md_ctx, mask ) ) != 0 )
            goto exit;

        for( i = 0; i < use_len; ++i )
            *p++ ^= mask[i];

        counter[3]++;

        dlen -= use_len;
    }

exit:
    mbedtls_zeroize( mask, sizeof( mask ) );

    return( ret );
}